

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

optional<common::PSBTError> __thiscall
wallet::DescriptorScriptPubKeyMan::FillPSBT
          (DescriptorScriptPubKeyMan *this,PartiallySignedTransaction *psbtx,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  pointer pPVar1;
  element_type *peVar2;
  iterator __position;
  CPubKey *pCVar3;
  CPubKey *pCVar4;
  pointer pCVar5;
  bool bVar6;
  TxoutType TVar7;
  FlatSigningProvider *__s;
  _Rb_tree_header *p_Var8;
  _Rb_tree_node_base *p_Var9;
  pointer pCVar10;
  ulong uVar11;
  undefined8 uVar12;
  ulong uVar13;
  ulong uVar14;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  PSBTInput *input;
  XOnlyPubKey *pubkey;
  pointer pCVar15;
  long lVar16;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  sols;
  vector<CPubKey,_std::allocator<CPubKey>_> pubkeys;
  CPubKey fullpubkey;
  uchar b [33];
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_118;
  vector<CPubKey,_std::allocator<CPubKey>_> local_f8;
  undefined1 local_e0 [8];
  FlatSigningProvider *local_d8;
  undefined1 local_d0 [80];
  undefined1 uStack_80;
  undefined7 uStack_7f;
  undefined1 local_78 [32];
  undefined1 local_58 [24];
  undefined8 uStack_40;
  _Base_ptr local_38;
  
  local_38 = *(_Base_ptr *)(in_FS_OFFSET + 0x28);
  if (n_signed != (int *)0x0) {
    *n_signed = 0;
  }
  pCVar15 = *(pointer *)
             &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
  if ((psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish !=
      pCVar15) {
    uVar11 = 0;
    do {
      pPVar1 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar13 = ((long)(psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 5) *
               -0x70a3d70a3d70a3d7;
      if (uVar13 < uVar11 || uVar13 - uVar11 == 0) {
        if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
          uVar12 = std::__throw_out_of_range_fmt
                             (
                             "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             );
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_118);
          if (local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start != (CPubKey *)0x0) {
            operator_delete(local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_e0 != (undefined1  [8])0x0) {
            std::default_delete<FlatSigningProvider>::operator()
                      ((default_delete<FlatSigningProvider> *)local_e0,
                       (FlatSigningProvider *)local_e0);
          }
          if (local_d8 != (FlatSigningProvider *)0x0) {
            std::default_delete<FlatSigningProvider>::operator()
                      ((default_delete<FlatSigningProvider> *)&local_d8,local_d8);
          }
          if (0x1c < uStack_40._4_4_) {
            free((void *)local_58._0_8_);
          }
          if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
            _Unwind_Resume(uVar12);
          }
        }
        goto LAB_00225c14;
      }
      input = pPVar1 + uVar11;
      bVar6 = PSBTInputSigned(input);
      if (!bVar6) {
        if (((sign) &&
            ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
             super__Optional_payload_base<int>._M_engaged == true)) &&
           ((input->sighash_type).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>._M_payload._M_value != sighash_type)) {
          uVar13 = 1;
          uVar11 = 0x100000000;
          goto LAB_00225a6b;
        }
        local_58._16_8_ = 0;
        uStack_40 = (_Base_ptr)0x0;
        local_58._0_8_ = (_Base_ptr)0x0;
        local_58._8_8_ = 0;
        if ((input->witness_utxo).nValue == -1) {
          peVar2 = (input->non_witness_utxo).
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar2 == (element_type *)0x0) goto LAB_0022596b;
          uVar13 = (ulong)pCVar15[uVar11].prevout.n;
          lVar16 = (long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                         super__Vector_impl_data._M_start;
          uVar14 = ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                          .super__Vector_impl_data._M_finish - lVar16 >> 3) * -0x3333333333333333;
          if (uVar14 < uVar13 || uVar14 - uVar13 == 0) {
            uVar11 = 0x100000000;
            uVar13 = 0;
            goto LAB_00225a6b;
          }
          other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)(lVar16 + uVar13 * 0x28 + 8);
        }
        else {
          other = &(input->witness_utxo).scriptPubKey.super_CScriptBase;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58,other);
        __s = (FlatSigningProvider *)operator_new(0xf8);
        memset(__s,0,0xe0);
        (__s->super_SigningProvider)._vptr_SigningProvider =
             (_func_int **)&PTR__FlatSigningProvider_006bfd40;
        p_Var8 = &(__s->scripts)._M_t._M_impl.super__Rb_tree_header;
        (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
        (__s->scripts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
        p_Var8 = &(__s->pubkeys)._M_t._M_impl.super__Rb_tree_header;
        (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
        (__s->pubkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
        p_Var8 = &(__s->origins)._M_t._M_impl.super__Rb_tree_header;
        (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
        (__s->origins)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
        p_Var8 = &(__s->keys)._M_t._M_impl.super__Rb_tree_header;
        (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
        (__s->keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
        p_Var8 = &(__s->tr_trees)._M_t._M_impl.super__Rb_tree_header;
        (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var8->_M_header;
        (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var8->_M_header;
        (__s->tr_trees)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_d8 = __s;
        GetSigningProvider((DescriptorScriptPubKeyMan *)local_e0,(CScript *)this,SUB81(local_58,0));
        if (local_e0 == (undefined1  [8])0x0) {
          local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_start = (CPubKey *)0x0;
          local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_finish = (CPubKey *)0x0;
          local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (CPubKey *)0x0;
          std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve
                    (&local_f8,
                     (input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_node_count + 2);
          p_Var9 = (input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          __position._M_current =
               local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
               super__Vector_impl_data._M_finish;
          while (local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish = __position._M_current,
                (_Rb_tree_header *)p_Var9 !=
                &(input->hd_keypaths)._M_t._M_impl.super__Rb_tree_header) {
            if (__position._M_current ==
                local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<CPubKey,std::allocator<CPubKey>>::_M_realloc_insert<CPubKey_const&>
                        ((vector<CPubKey,std::allocator<CPubKey>> *)&local_f8,__position,
                         (CPubKey *)(p_Var9 + 1));
            }
            else {
              memcpy(__position._M_current,p_Var9 + 1,0x41);
              local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            __position._M_current =
                 local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          local_118.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
          local_118.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_118.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          TVar7 = Solver((CScript *)local_58,&local_118);
          if (TVar7 == WITNESS_V1_TAPROOT) {
            local_d0[0] = 2;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_insert_rval
                      (local_118.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (const_iterator)
                       ((local_118.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start,(value_type_conflict *)local_d0);
            std::vector<CPubKey,std::allocator<CPubKey>>::
            emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((vector<CPubKey,std::allocator<CPubKey>> *)&local_f8,
                       local_118.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            *((local_118.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\x03';
            std::vector<CPubKey,std::allocator<CPubKey>>::
            emplace_back<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                      ((vector<CPubKey,std::allocator<CPubKey>> *)&local_f8,
                       local_118.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          }
          p_Var9 = (input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          pCVar3 = local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          while (local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                 super__Vector_impl_data._M_finish = pCVar3,
                pCVar4 = local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (_Rb_tree_header *)p_Var9 !=
                &(input->m_tap_bip32_paths)._M_t._M_impl.super__Rb_tree_header) {
            local_78._24_8_ = (_Base_ptr)0x300000002;
            lVar16 = 0;
            do {
              local_d0[0x48] = local_d0[lVar16 + 0x70];
              local_78._1_7_ = SUB87(p_Var9[1]._M_left,0);
              local_78[8] = (undefined1)((ulong)p_Var9[1]._M_left >> 0x38);
              local_78._9_7_ = SUB87(p_Var9[1]._M_right,0);
              local_78[0x10] = (undefined1)((ulong)p_Var9[1]._M_right >> 0x38);
              local_d0._73_7_ = (undefined7)*(undefined8 *)(p_Var9 + 1);
              uStack_80 = (undefined1)((ulong)*(undefined8 *)(p_Var9 + 1) >> 0x38);
              uStack_7f = SUB87(p_Var9[1]._M_parent,0);
              local_78[0] = (undefined1)((ulong)p_Var9[1]._M_parent >> 0x38);
              local_d0[0] = 0xff;
              CPubKey::Set<unsigned_char*>((CPubKey *)local_d0,local_d0 + 0x48,local_d0 + 0x69);
              pCVar5 = local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<CPubKey,std::allocator<CPubKey>>::_M_realloc_insert<CPubKey_const&>
                          ((vector<CPubKey,std::allocator<CPubKey>> *)&local_f8,
                           (iterator)
                           local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                           super__Vector_impl_data._M_finish,(CPubKey *)local_d0);
              }
              else {
                memcpy(local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish,(DescriptorScriptPubKeyMan *)local_d0,0x41)
                ;
                local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                super__Vector_impl_data._M_finish = pCVar5 + 1;
              }
              lVar16 = lVar16 + 4;
            } while (lVar16 != 8);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            pCVar3 = local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          for (; pCVar4 != pCVar3; pCVar4 = pCVar4 + 1) {
            GetSigningProvider((DescriptorScriptPubKeyMan *)local_d0,(CPubKey *)this);
            if (((FlatSigningProvider *)local_d0._0_8_ != (FlatSigningProvider *)0x0) &&
               (FlatSigningProvider::Merge(local_d8,(FlatSigningProvider *)local_d0._0_8_),
               (FlatSigningProvider *)local_d0._0_8_ != (FlatSigningProvider *)0x0)) {
              std::default_delete<FlatSigningProvider>::operator()
                        ((default_delete<FlatSigningProvider> *)local_d0,
                         (FlatSigningProvider *)local_d0._0_8_);
            }
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_118);
          if (local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
              super__Vector_impl_data._M_start != (CPubKey *)0x0) {
            operator_delete(local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_f8.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        else {
          FlatSigningProvider::Merge(local_d8,(FlatSigningProvider *)local_e0);
        }
        local_d0._0_8_ = &PTR__SigningProvider_006bfcc8;
        local_d0._16_8_ = local_d8;
        local_d0[8] = !sign;
        local_d0[9] = !bip32derivs;
        SignPSBTInput((SigningProvider *)local_d0,psbtx,(int)uVar11,txdata,sighash_type,
                      (SignatureData *)0x0,finalize);
        bVar6 = PSBTInputSigned(input);
        if ((n_signed != (int *)0x0) && (bVar6 || !sign)) {
          *n_signed = *n_signed + 1;
        }
        if (local_e0 != (undefined1  [8])0x0) {
          std::default_delete<FlatSigningProvider>::operator()
                    ((default_delete<FlatSigningProvider> *)local_e0,(FlatSigningProvider *)local_e0
                    );
        }
        if (local_d8 != (FlatSigningProvider *)0x0) {
          std::default_delete<FlatSigningProvider>::operator()
                    ((default_delete<FlatSigningProvider> *)&local_d8,local_d8);
        }
        if (0x1c < uStack_40._4_4_) {
          free((void *)local_58._0_8_);
        }
      }
LAB_0022596b:
      uVar11 = (ulong)((int)uVar11 + 1);
      pCVar15 = *(pointer *)
                 &(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
      uVar13 = ((long)(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                      .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
                      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar15 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar11 <= uVar13 && uVar13 - uVar11 != 0);
  }
  pCVar10 = (psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
            super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
            _M_start;
  uVar13 = 0;
  if ((psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data._M_finish
      != pCVar10) {
    uVar11 = 0;
    do {
      (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x15])
                (local_d0 + 0x48,this,&pCVar10[uVar11].scriptPubKey);
      if ((FlatSigningProvider *)CONCAT71(local_d0._73_7_,local_d0[0x48]) !=
          (FlatSigningProvider *)0x0) {
        local_d0._0_8_ = &PTR__SigningProvider_006bfcc8;
        local_d0[8] = 1;
        local_d0[9] = !bip32derivs;
        local_d0._16_8_ = (FlatSigningProvider *)CONCAT71(local_d0._73_7_,local_d0[0x48]);
        UpdatePSBTOutput((SigningProvider *)local_d0,psbtx,(int)uVar11);
        if ((long *)CONCAT71(local_d0._73_7_,local_d0[0x48]) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT71(local_d0._73_7_,local_d0[0x48]) + 8))();
        }
      }
      uVar11 = (ulong)((int)uVar11 + 1);
      pCVar10 = (psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
                super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
                _M_start;
      uVar14 = ((long)(psbtx->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload
                      .super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
                      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar10 >> 3) * -0x3333333333333333;
    } while (uVar11 <= uVar14 && uVar14 - uVar11 != 0);
  }
  uVar11 = 0;
LAB_00225a6b:
  if (*(_Base_ptr *)(in_FS_OFFSET + 0x28) == local_38) {
    return (optional<common::PSBTError>)(uVar11 | uVar13);
  }
LAB_00225c14:
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> DescriptorScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbtx, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (n_signed) {
        *n_signed = 0;
    }
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        const CTxIn& txin = psbtx.tx->vin[i];
        PSBTInput& input = psbtx.inputs.at(i);

        if (PSBTInputSigned(input)) {
            continue;
        }

        // Get the Sighash type
        if (sign && input.sighash_type != std::nullopt && *input.sighash_type != sighash_type) {
            return PSBTError::SIGHASH_MISMATCH;
        }

        // Get the scriptPubKey to know which SigningProvider to use
        CScript script;
        if (!input.witness_utxo.IsNull()) {
            script = input.witness_utxo.scriptPubKey;
        } else if (input.non_witness_utxo) {
            if (txin.prevout.n >= input.non_witness_utxo->vout.size()) {
                return PSBTError::MISSING_INPUTS;
            }
            script = input.non_witness_utxo->vout[txin.prevout.n].scriptPubKey;
        } else {
            // There's no UTXO so we can just skip this now
            continue;
        }

        std::unique_ptr<FlatSigningProvider> keys = std::make_unique<FlatSigningProvider>();
        std::unique_ptr<FlatSigningProvider> script_keys = GetSigningProvider(script, /*include_private=*/sign);
        if (script_keys) {
            keys->Merge(std::move(*script_keys));
        } else {
            // Maybe there are pubkeys listed that we can sign for
            std::vector<CPubKey> pubkeys;
            pubkeys.reserve(input.hd_keypaths.size() + 2);

            // ECDSA Pubkeys
            for (const auto& [pk, _] : input.hd_keypaths) {
                pubkeys.push_back(pk);
            }

            // Taproot output pubkey
            std::vector<std::vector<unsigned char>> sols;
            if (Solver(script, sols) == TxoutType::WITNESS_V1_TAPROOT) {
                sols[0].insert(sols[0].begin(), 0x02);
                pubkeys.emplace_back(sols[0]);
                sols[0][0] = 0x03;
                pubkeys.emplace_back(sols[0]);
            }

            // Taproot pubkeys
            for (const auto& pk_pair : input.m_tap_bip32_paths) {
                const XOnlyPubKey& pubkey = pk_pair.first;
                for (unsigned char prefix : {0x02, 0x03}) {
                    unsigned char b[33] = {prefix};
                    std::copy(pubkey.begin(), pubkey.end(), b + 1);
                    CPubKey fullpubkey;
                    fullpubkey.Set(b, b + 33);
                    pubkeys.push_back(fullpubkey);
                }
            }

            for (const auto& pubkey : pubkeys) {
                std::unique_ptr<FlatSigningProvider> pk_keys = GetSigningProvider(pubkey);
                if (pk_keys) {
                    keys->Merge(std::move(*pk_keys));
                }
            }
        }

        SignPSBTInput(HidingSigningProvider(keys.get(), /*hide_secret=*/!sign, /*hide_origin=*/!bip32derivs), psbtx, i, &txdata, sighash_type, nullptr, finalize);

        bool signed_one = PSBTInputSigned(input);
        if (n_signed && (signed_one || !sign)) {
            // If sign is false, we assume that we _could_ sign if we get here. This
            // will never have false negatives; it is hard to tell under what i
            // circumstances it could have false positives.
            (*n_signed)++;
        }
    }

    // Fill in the bip32 keypaths and redeemscripts for the outputs so that hardware wallets can identify change
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        std::unique_ptr<SigningProvider> keys = GetSolvingProvider(psbtx.tx->vout.at(i).scriptPubKey);
        if (!keys) {
            continue;
        }
        UpdatePSBTOutput(HidingSigningProvider(keys.get(), /*hide_secret=*/true, /*hide_origin=*/!bip32derivs), psbtx, i);
    }

    return {};
}